

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.cpp
# Opt level: O0

QDebug qt_QMetaEnum_flagDebugOperator(QDebug *debug,quint64 value,QMetaObject *meta,char *name)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  QMetaEnum *in_RSI;
  Stream *in_RDI;
  QMetaEnum *in_R8;
  long in_FS_OFFSET;
  bool enumScope;
  char *scope;
  bool classScope;
  int verbosity;
  QMetaEnum me;
  QDebugStateSaver saver;
  undefined7 in_stack_ffffffffffffff08;
  char in_stack_ffffffffffffff0f;
  QMetaEnum *in_stack_ffffffffffffff10;
  QMetaEnum *this;
  QMetaEnum *in_stack_ffffffffffffff18;
  QDebug *in_stack_ffffffffffffff20;
  undefined6 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2e;
  undefined1 in_stack_ffffffffffffff2f;
  QDebugStateSaver *in_stack_ffffffffffffff30;
  QDebug *in_stack_ffffffffffffff38;
  Stream *t;
  undefined4 in_stack_ffffffffffffff90;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  t = in_RDI;
  iVar5 = QDebug::verbosity((QDebug *)in_RSI);
  QDebugStateSaver::QDebugStateSaver
            (in_stack_ffffffffffffff30,
             (QDebug *)
             CONCAT17(in_stack_ffffffffffffff2f,
                      CONCAT16(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28)));
  QDebug::resetFormat((QDebug *)in_stack_ffffffffffffff10);
  QDebug::noquote((QDebug *)in_RSI);
  QDebug::nospace((QDebug *)in_RSI);
  QMetaObject::indexOfEnumerator
            ((QMetaObject *)in_stack_ffffffffffffff10,
             (char *)CONCAT17(in_stack_ffffffffffffff2f,
                              CONCAT16(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28)));
  QMetaObject::enumerator
            ((QMetaObject *)
             CONCAT17(in_stack_ffffffffffffff2f,
                      CONCAT16(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28)),
             (int)((ulong)in_stack_ffffffffffffff20 >> 0x20));
  bVar2 = 1 < iVar5;
  if (bVar2) {
    QDebug::operator<<(in_stack_ffffffffffffff20,(char16_t *)in_stack_ffffffffffffff38);
    in_stack_ffffffffffffff38 = (QDebug *)QMetaEnum::scope(in_stack_ffffffffffffff10);
    if (in_stack_ffffffffffffff38 != (QDebug *)0x0) {
      QDebug::operator<<(in_stack_ffffffffffffff38,(char *)t);
      QDebug::operator<<(in_stack_ffffffffffffff20,(char16_t *)in_stack_ffffffffffffff38);
    }
  }
  bVar4 = QMetaEnum::isScoped((QMetaEnum *)
                              CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
  bVar3 = 0 < iVar5;
  if (bVar4 || bVar3) {
    in_stack_ffffffffffffff18 = in_RSI;
    in_stack_ffffffffffffff20 = (QDebug *)QMetaEnum::enumName(in_RSI);
    QDebug::operator<<(in_stack_ffffffffffffff38,(char *)t);
    if (bVar2) {
      QDebug::operator<<((QDebug *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff0f);
    }
    QDebug::operator<<((QDebug *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff0f);
  }
  this = in_RSI;
  QMetaEnum::valueToKeys(in_R8,CONCAT44(iVar5,in_stack_ffffffffffffff90));
  QDebug::operator<<(in_stack_ffffffffffffff20,(QByteArray *)in_stack_ffffffffffffff18);
  QByteArray::~QByteArray((QByteArray *)0x279ec4);
  if (bVar4 || bVar3) {
    QDebug::operator<<((QDebug *)this,in_stack_ffffffffffffff0f);
  }
  QDebug::QDebug((QDebug *)in_RDI,(QDebug *)in_RSI);
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)this);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDebug)t;
  }
  __stack_chk_fail();
}

Assistant:

QDebug qt_QMetaEnum_flagDebugOperator(QDebug &debug, quint64 value, const QMetaObject *meta, const char *name)
{
    const int verbosity = debug.verbosity();

    QDebugStateSaver saver(debug);
    debug.resetFormat();
    debug.noquote();
    debug.nospace();

    const QMetaEnum me = meta->enumerator(meta->indexOfEnumerator(name));

    const bool classScope = verbosity >= QDebug::DefaultVerbosity;
    if (classScope) {
        debug << u"QFlags<";

        if (const char *scope = me.scope())
            debug << scope << u"::";
    }

    const bool enumScope = me.isScoped() || verbosity > QDebug::MinimumVerbosity;
    if (enumScope) {
        debug << me.enumName();
        if (classScope)
            debug << '>';
        debug << '(';
    }

    debug << me.valueToKeys(value);

    if (enumScope)
        debug << ')';

    return debug;
}